

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

_Bool mi_heap_page_never_delayed_free
                (mi_heap_t *heap,mi_page_queue_t *pq,mi_page_t *page,void *arg1,void *arg2)

{
  mi_page_t *in_RCX;
  undefined8 in_R8;
  
  _mi_page_use_delayed_free
            (in_RCX,(mi_delayed_t)((ulong)in_R8 >> 0x20),SUB81((ulong)in_R8 >> 0x18,0));
  return true;
}

Assistant:

static bool mi_heap_page_never_delayed_free(mi_heap_t* heap, mi_page_queue_t* pq, mi_page_t* page, void* arg1, void* arg2) {
  MI_UNUSED(arg1);
  MI_UNUSED(arg2);
  MI_UNUSED(heap);
  MI_UNUSED(pq);
  _mi_page_use_delayed_free(page, MI_NEVER_DELAYED_FREE, false);
  return true; // don't break
}